

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O1

function * getMainFunc(vm *v)

{
  module *pmVar1;
  export_pointer paVar2;
  int iVar3;
  function *pfVar4;
  function_index fVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  
  pmVar1 = v->m;
  if ((pmVar1->start_sec).start_segment_count == 1) {
    fVar5 = *(pmVar1->start_sec).start_segment_addr;
  }
  else {
    uVar7 = (ulong)(pmVar1->export_sec).export_segment_count;
    if (uVar7 == 0) {
      fVar5 = 0xffffffff;
    }
    else {
      paVar2 = (pmVar1->export_sec).export_segment_addr;
      fVar5 = 0xffffffff;
      lVar6 = 0;
      do {
        if (((&(paVar2->ex_desc).tag)[lVar6] == '\0') &&
           (iVar3 = strcmp(*(char **)((long)&paVar2->name + lVar6),"main"), iVar3 == 0)) {
          fVar5 = *(function_index *)((long)&(paVar2->ex_desc).index + lVar6);
          bVar8 = true;
        }
        else {
          bVar8 = false;
        }
      } while ((!bVar8) && (bVar8 = uVar7 * 0x10 + -0x10 != lVar6, lVar6 = lVar6 + 0x10, bVar8));
    }
  }
  if (fVar5 == 0xffffffff) {
    return (function *)0x0;
  }
  pfVar4 = (function *)(*(v->func).get_ele)(&v->func,(uint64)fVar5);
  return pfVar4;
}

Assistant:

function *getMainFunc(vm *v) {
    function_index f_index = -1;
    module *m = v->m;
    if (m->start_sec.start_segment_count == 1) {
        /*获取启动段的启动函数的索引*/
        f_index = *(m->start_sec.start_segment_addr);
    } else {
        for (int i = 0; i < m->export_sec.export_segment_count; ++i) {
            export_pointer ep = m->export_sec.export_segment_addr + i;
            if (ep->ex_desc.tag == func_im_export_tag && !strcmp((const char *) ep->name, "main")) {
                f_index = ep->ex_desc.index;
                break;
            }
        }
    }
    function *f = NULL;
    if (f_index != -1)
        f = v->func.get_ele(&v->func, f_index);
    return f;
}